

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O2

int __thiscall
ncnn::Reshape::forward
          (Reshape *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *this_00;
  Mat *pMVar3;
  int *piVar4;
  Allocator *pAVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  uint uVar11;
  uint local_88;
  int outh;
  int outc;
  int outd;
  Mat local_78;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_88 = this->w;
  outh = this->h;
  outd = this->d;
  outc = this->c;
  if ((this->shape_expr)._M_string_length != 0) {
    eval_shape_expr(this,bottom_blobs,(int *)&local_88,&outh,&outd,&outc);
  }
  if (3 < this->ndim - 1U) goto LAB_002fd03d;
  iVar9 = this_00->dims;
  uVar8 = this_00->w;
  iVar1 = this_00->h;
  iVar2 = this_00->c;
  uVar11 = this_00->d * iVar2 * iVar1 * uVar8;
  puVar10 = &switchD_002fc993::switchdataD_0053dd64;
  switch(this->ndim) {
  case 1:
    if (local_88 == 0) {
      local_88 = uVar8;
    }
    if (local_88 == 0xffffffff) {
      local_88 = uVar11;
    }
    puVar10 = (uint *)(ulong)local_88;
    if ((iVar9 == 1) && (uVar8 == local_88)) {
LAB_002fcc1e:
      if (pMVar3 != this_00) {
        piVar4 = this_00->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pAVar5 = pMVar3->allocator;
            if (pAVar5 == (Allocator *)0x0) {
              free(pMVar3->data);
            }
            else {
              (*pAVar5->_vptr_Allocator[3])(pAVar5,pMVar3->data,puVar10);
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->c = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        piVar4 = this_00->refcount;
        pMVar3->data = this_00->data;
        pMVar3->refcount = piVar4;
        pMVar3->elemsize = this_00->elemsize;
        pMVar3->elempack = this_00->elempack;
        pMVar3->allocator = this_00->allocator;
        iVar9 = this_00->w;
        iVar1 = this_00->h;
        iVar2 = this_00->d;
        pMVar3->dims = this_00->dims;
        pMVar3->w = iVar9;
        pMVar3->h = iVar1;
        pMVar3->d = iVar2;
        pMVar3->c = this_00->c;
        pMVar3->cstep = this_00->cstep;
        return 0;
      }
      return 0;
    }
    Mat::reshape(&local_78,this_00,local_88,opt->blob_allocator);
    if (pMVar3 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar4 = pMVar3->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pMVar3->allocator == (Allocator *)0x0) {
            free(pMVar3->data);
          }
          else {
            (*pMVar3->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3->data = local_78.data;
      pMVar3->refcount = local_78.refcount;
      pMVar3->elemsize = local_78.elemsize;
      pMVar3->elempack = local_78.elempack;
      pMVar3->allocator = local_78.allocator;
      pMVar3->dims = local_78.dims;
      pMVar3->w = local_78.w;
      pMVar3->h = local_78.h;
      pMVar3->d = local_78.d;
      pMVar3->c = local_78.c;
      pMVar3->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar9 = this->ndim;
    if (iVar9 == 2) goto LAB_002fcdb0;
    break;
  case 2:
    if (local_88 != 0) {
      uVar8 = local_88;
    }
    if (outh == 0) {
      outh = iVar1;
    }
    if (uVar8 == 0xffffffff) {
      uVar8 = (int)uVar11 / outh;
      puVar10 = (uint *)((long)(int)uVar11 % (long)outh & 0xffffffff);
    }
    if (outh == -1) {
      outh = (int)uVar11 / (int)uVar8;
      puVar10 = (uint *)((long)(int)uVar11 % (long)(int)uVar8 & 0xffffffff);
    }
    local_88 = uVar8;
    if ((iVar9 == 2) && (iVar1 == outh)) goto LAB_002fcc1e;
LAB_002fcdb0:
    Mat::reshape(&local_78,this_00,local_88,outh,opt->blob_allocator);
    if (pMVar3 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar4 = pMVar3->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pMVar3->allocator == (Allocator *)0x0) {
            free(pMVar3->data);
          }
          else {
            (*pMVar3->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3->data = local_78.data;
      pMVar3->refcount = local_78.refcount;
      pMVar3->elemsize = local_78.elemsize;
      pMVar3->elempack = local_78.elempack;
      pMVar3->allocator = local_78.allocator;
      pMVar3->dims = local_78.dims;
      pMVar3->w = local_78.w;
      pMVar3->h = local_78.h;
      pMVar3->d = local_78.d;
      pMVar3->c = local_78.c;
      pMVar3->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar9 = this->ndim;
    break;
  case 3:
    if (local_88 != 0) {
      uVar8 = local_88;
    }
    if (outh != 0) {
      iVar1 = outh;
    }
    if (outc == 0) {
      outc = iVar2;
    }
    local_88 = uVar8;
    if (uVar8 == 0xffffffff) {
      uVar6 = (ulong)(uint)((int)((long)(int)uVar11 / (long)outc) >> 0x1f) << 0x20 |
              (long)(int)uVar11 / (long)outc & 0xffffffffU;
      puVar10 = (uint *)((long)uVar6 % (long)iVar1 & 0xffffffff);
      local_88 = (uint)((long)uVar6 / (long)iVar1);
    }
    outh = iVar1;
    if (iVar1 == -1) {
      uVar6 = (ulong)(uint)((int)((long)(int)uVar11 / (long)outc) >> 0x1f) << 0x20 |
              (long)(int)uVar11 / (long)outc & 0xffffffffU;
      puVar10 = (uint *)((long)uVar6 % (long)(int)local_88 & 0xffffffff);
      outh = (int)((long)uVar6 / (long)(int)local_88);
    }
    if (outc == -1) {
      uVar6 = (ulong)(uint)((int)((long)(int)uVar11 / (long)outh) >> 0x1f) << 0x20 |
              (long)(int)uVar11 / (long)outh & 0xffffffffU;
      puVar10 = (uint *)((long)uVar6 % (long)(int)local_88 & 0xffffffff);
      outc = (int)((long)uVar6 / (long)(int)local_88);
    }
    if ((iVar9 == 3) && (iVar2 == outc)) {
      if (pMVar3 != this_00) {
        piVar4 = this_00->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pAVar5 = pMVar3->allocator;
            if (pAVar5 == (Allocator *)0x0) {
              free(pMVar3->data);
            }
            else {
              (*pAVar5->_vptr_Allocator[3])(pAVar5,pMVar3->data,puVar10);
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        piVar4 = this_00->refcount;
        pMVar3->data = this_00->data;
        pMVar3->refcount = piVar4;
        pMVar3->elemsize = this_00->elemsize;
        pMVar3->elempack = this_00->elempack;
        pMVar3->allocator = this_00->allocator;
        iVar9 = this_00->w;
        iVar1 = this_00->h;
        iVar2 = this_00->d;
        pMVar3->dims = this_00->dims;
        pMVar3->w = iVar9;
        pMVar3->h = iVar1;
        pMVar3->d = iVar2;
        pMVar3->c = this_00->c;
        pMVar3->cstep = this_00->cstep;
      }
      pMVar3->w = local_88;
      pMVar3->h = outh;
      return 0;
    }
    goto LAB_002fce89;
  case 4:
    if (local_88 != 0) {
      uVar8 = local_88;
    }
    if (outh != 0) {
      iVar1 = outh;
    }
    if (outc == 0) {
      outc = iVar2;
    }
    iVar7 = this_00->d;
    if (outd != 0) {
      iVar7 = outd;
    }
    local_88 = uVar8;
    if (uVar8 == 0xffffffff) {
      uVar6 = (long)((ulong)(uint)((int)((long)(int)uVar11 / (long)outc) >> 0x1f) << 0x20 |
                    (long)(int)uVar11 / (long)outc & 0xffffffffU) / (long)iVar7;
      uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      puVar10 = (uint *)((long)uVar6 % (long)iVar1 & 0xffffffff);
      local_88 = (uint)((long)uVar6 / (long)iVar1);
    }
    outh = iVar1;
    if (iVar1 == -1) {
      uVar6 = (long)((ulong)(uint)((int)((long)(int)uVar11 / (long)outc) >> 0x1f) << 0x20 |
                    (long)(int)uVar11 / (long)outc & 0xffffffffU) / (long)iVar7;
      uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      puVar10 = (uint *)((long)uVar6 % (long)(int)local_88 & 0xffffffff);
      outh = (int)((long)uVar6 / (long)(int)local_88);
    }
    outd = iVar7;
    if (iVar7 == -1) {
      uVar6 = (long)((ulong)(uint)((int)((long)(int)uVar11 / (long)outc) >> 0x1f) << 0x20 |
                    (long)(int)uVar11 / (long)outc & 0xffffffffU) / (long)outh;
      uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      puVar10 = (uint *)((long)uVar6 % (long)(int)local_88 & 0xffffffff);
      outd = (int)((long)uVar6 / (long)(int)local_88);
    }
    if (outc == -1) {
      uVar6 = (long)((ulong)(uint)((int)((long)(int)uVar11 / (long)outd) >> 0x1f) << 0x20 |
                    (long)(int)uVar11 / (long)outd & 0xffffffffU) / (long)outh;
      uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      puVar10 = (uint *)((long)uVar6 % (long)(int)local_88 & 0xffffffff);
      outc = (int)((long)uVar6 / (long)(int)local_88);
    }
    if ((iVar9 == 4) && (iVar2 == outc)) {
      if (pMVar3 != this_00) {
        piVar4 = this_00->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pAVar5 = pMVar3->allocator;
            if (pAVar5 == (Allocator *)0x0) {
              free(pMVar3->data);
            }
            else {
              (*pAVar5->_vptr_Allocator[3])(pAVar5,pMVar3->data,puVar10);
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        piVar4 = this_00->refcount;
        pMVar3->data = this_00->data;
        pMVar3->refcount = piVar4;
        pMVar3->elemsize = this_00->elemsize;
        pMVar3->elempack = this_00->elempack;
        pMVar3->allocator = this_00->allocator;
        iVar9 = this_00->w;
        iVar1 = this_00->h;
        iVar2 = this_00->d;
        pMVar3->dims = this_00->dims;
        pMVar3->w = iVar9;
        pMVar3->h = iVar1;
        pMVar3->d = iVar2;
        pMVar3->c = this_00->c;
        pMVar3->cstep = this_00->cstep;
      }
      pMVar3->w = local_88;
      pMVar3->h = outh;
      pMVar3->d = outd;
      return 0;
    }
    goto LAB_002fcf67;
  }
  if (iVar9 == 3) {
LAB_002fce89:
    Mat::reshape(&local_78,this_00,local_88,outh,outc,opt->blob_allocator);
    if (pMVar3 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar4 = pMVar3->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pMVar3->allocator == (Allocator *)0x0) {
            free(pMVar3->data);
          }
          else {
            (*pMVar3->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3->data = local_78.data;
      pMVar3->refcount = local_78.refcount;
      pMVar3->elemsize = local_78.elemsize;
      pMVar3->elempack = local_78.elempack;
      pMVar3->allocator = local_78.allocator;
      pMVar3->dims = local_78.dims;
      pMVar3->w = local_78.w;
      pMVar3->h = local_78.h;
      pMVar3->d = local_78.d;
      pMVar3->c = local_78.c;
      pMVar3->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar9 = this->ndim;
  }
  if (iVar9 == 4) {
LAB_002fcf67:
    Mat::reshape(&local_78,this_00,local_88,outh,outd,outc,opt->blob_allocator);
    if (pMVar3 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar4 = pMVar3->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (pMVar3->allocator == (Allocator *)0x0) {
            free(pMVar3->data);
          }
          else {
            (*pMVar3->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3->data = local_78.data;
      pMVar3->refcount = local_78.refcount;
      pMVar3->elemsize = local_78.elemsize;
      pMVar3->elempack = local_78.elempack;
      pMVar3->allocator = local_78.allocator;
      pMVar3->dims = local_78.dims;
      pMVar3->w = local_78.w;
      pMVar3->h = local_78.h;
      pMVar3->d = local_78.d;
      pMVar3->c = local_78.c;
      pMVar3->cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_002fd03d:
  if ((pMVar3->data == (void *)0x0) || (iVar9 = 0, (long)pMVar3->c * pMVar3->cstep == 0)) {
    iVar9 = -100;
  }
  return iVar9;
}

Assistant:

int Reshape::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    Mat& top_blob = top_blobs[0];

    // resolve out shape
    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (!shape_expr.empty())
    {
        eval_shape_expr(bottom_blobs, outw, outh, outd, outc);
    }

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}